

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O2

bool google::protobuf::compiler::ruby::GenerateMessage
               (Descriptor *message,Printer *printer,string *error)

{
  long lVar1;
  LogMessage *other;
  OneofDescriptor *pOVar2;
  int i;
  long lVar3;
  int i_3;
  int i_1;
  long lVar4;
  LogFinisher local_69;
  LogMessage local_68;
  
  if ((0 < *(int *)(message + 0x78)) || (0 < *(int *)(message + 0x7c))) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_WARNING,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/ruby/ruby_generator.cc"
               ,0xfa);
    other = internal::LogMessage::operator<<
                      (&local_68,"Extensions are not yet supported for proto2 .proto files.");
    internal::LogFinisher::operator=(&local_69,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if (*(char *)(*(long *)(message + 0x20) + 0x4b) == '\0') {
    io::Printer::Print<char[5],std::__cxx11::string>
              (printer,"add_message \"$name$\" do\n",(char (*) [5])0x3de831,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (*(long *)(message + 8) + 0x20));
    io::Printer::Indent(printer);
    lVar4 = 0;
    for (lVar3 = 0; lVar3 < *(int *)(message + 4); lVar3 = lVar3 + 1) {
      lVar1 = *(long *)(message + 0x28);
      pOVar2 = FieldDescriptor::real_containing_oneof((FieldDescriptor *)(lVar1 + lVar4));
      if (pOVar2 == (OneofDescriptor *)0x0) {
        GenerateField((FieldDescriptor *)(lVar1 + lVar4),printer);
      }
      lVar4 = lVar4 + 0x48;
    }
    lVar3 = 0;
    for (lVar4 = 0; lVar4 < *(int *)(message + 0x6c); lVar4 = lVar4 + 1) {
      GenerateOneof((OneofDescriptor *)(*(long *)(message + 0x30) + lVar3),printer);
      lVar3 = lVar3 + 0x28;
    }
    io::Printer::Outdent(printer);
    io::Printer::Print<>(printer,"end\n");
    lVar3 = 0;
    for (lVar4 = 0; lVar4 < *(int *)(message + 0x70); lVar4 = lVar4 + 1) {
      GenerateMessage((Descriptor *)(*(long *)(message + 0x38) + lVar3),printer,error);
      lVar3 = lVar3 + 0x88;
    }
    lVar4 = 0;
    for (lVar3 = 0; lVar3 < *(int *)(message + 0x74); lVar3 = lVar3 + 1) {
      GenerateEnum((EnumDescriptor *)(*(long *)(message + 0x40) + lVar4),printer);
      lVar4 = lVar4 + 0x48;
    }
  }
  return true;
}

Assistant:

bool GenerateMessage(const Descriptor* message, io::Printer* printer,
                     std::string* error) {
  if (message->extension_range_count() > 0 || message->extension_count() > 0) {
    GOOGLE_LOG(WARNING) << "Extensions are not yet supported for proto2 .proto files.";
  }

  // Don't generate MapEntry messages -- we use the Ruby extension's native
  // support for map fields instead.
  if (message->options().map_entry()) {
    return true;
  }

  printer->Print(
    "add_message \"$name$\" do\n",
    "name", message->full_name());
  printer->Indent();

  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    if (!field->real_containing_oneof()) {
      GenerateField(field, printer);
    }
  }

  for (int i = 0; i < message->real_oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    GenerateOneof(oneof, printer);
  }

  printer->Outdent();
  printer->Print("end\n");

  for (int i = 0; i < message->nested_type_count(); i++) {
    if (!GenerateMessage(message->nested_type(i), printer, error)) {
      return false;
    }
  }
  for (int i = 0; i < message->enum_type_count(); i++) {
    GenerateEnum(message->enum_type(i), printer);
  }

  return true;
}